

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage1Runner.hpp
# Opt level: O2

void __thiscall Centaurus::Stage1Runner::signal_exit(Stage1Runner *this)

{
  void *pvVar1;
  int i;
  long lVar2;
  ulong uVar3;
  int iVar4;
  int i_1;
  bool bVar5;
  
  pvVar1 = (this->super_BaseRunner).m_sub_window;
  lVar2 = 0;
  iVar4 = 0;
  do {
    for (; uVar3 = (ulong)(this->super_BaseRunner).m_bank_num, lVar2 < (long)uVar3;
        lVar2 = lVar2 + 1) {
      iVar4 = (iVar4 + 1) - (uint)(*(int *)((long)pvVar1 + lVar2 * 8 + 4) == 0);
    }
    lVar2 = 0;
    bVar5 = iVar4 != 0;
    iVar4 = 0;
  } while (bVar5);
  for (lVar2 = 0; lVar2 < (int)uVar3; lVar2 = lVar2 + 1) {
    LOCK();
    *(undefined4 *)((long)pvVar1 + lVar2 * 8 + 4) = 6;
    UNLOCK();
    BaseRunner::release_semaphore(&this->super_BaseRunner);
    uVar3 = (ulong)(uint)(this->super_BaseRunner).m_bank_num;
  }
  return;
}

Assistant:

void signal_exit()
  {
    WindowBankEntry *banks = (WindowBankEntry *)m_sub_window;
    while (true) {
      int count = 0;
      for (int i = 0; i < m_bank_num; i++) {
        WindowBankState state = banks[i].state.load();
        if (state != WindowBankState::Free)
          count++;
      }
      if (count == 0) break;
    }
    for (int i = 0; i < m_bank_num; i++) {
      banks[i].state.store(WindowBankState::YouAreDone);
      release_semaphore();
    }
  }